

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Hospital::Find_Doctor_From_His_Field_vector
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Hospital *this,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *field)

{
  pointer pDVar1;
  __type _Var2;
  int local_54;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_54 = 0;
  while( true ) {
    pDVar1 = (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl
                       .super__Vector_impl_data._M_finish - (long)pDVar1) / 0x178) <=
        (ulong)(long)local_54) break;
    Doctor::Field_getter_abi_cxx11_(&local_50,pDVar1 + local_54);
    _Var2 = std::operator==(&local_50,field);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_54);
    }
    local_54 = local_54 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int>  Hospital::  Find_Doctor_From_His_Field_vector (vector<Doctor> All_Of_Doctors,string field){
    vector<int> finded ;
    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if (All_Of_Doctors[i].Field_getter() == field){
            finded.push_back(i);
        }
    }
    return finded;
}